

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void __thiscall snestistics::LargeBitfield::read_file(LargeBitfield *this,BigFile *f)

{
  uint uVar1;
  size_t sVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint32_t new_size;
  uint local_1c;
  
  local_1c = 0;
  sVar2 = fread(&local_1c,1,4,(FILE *)f->_file);
  f->_offset = f->_offset + sVar2;
  BigFile::validate(f);
  uVar1 = local_1c;
  uVar4 = (ulong)local_1c;
  if (local_1c != this->_num_elements) {
    if (this->_state != (uint32_t *)0x0) {
      operator_delete__(this->_state);
    }
    puVar3 = (uint32_t *)operator_new__(uVar4 * 4);
    this->_state = puVar3;
    this->_num_elements = uVar1;
  }
  sVar2 = fread(this->_state,1,uVar4 * 4,(FILE *)f->_file);
  f->_offset = f->_offset + sVar2;
  BigFile::validate(f);
  return;
}

Assistant:

void LargeBitfield::read_file(BigFile &f) {
	uint32_t new_size = 0;
	f.read(new_size);

	if (new_size != _num_elements) {
		delete[] _state;
		_state = new uint32_t[new_size];
		_num_elements = new_size;
	}

	f.read(_state, sizeof(uint32_t)*new_size);
}